

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_AddNodes_single
               (UA_Server *server,UA_Session *session,UA_AddNodesItem *item,
               UA_AddNodesResult *result,UA_InstantiationCallback *instantiationCallback)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  UA_Logger p_Var12;
  UA_StatusCode UVar13;
  char *pcVar14;
  undefined8 in_stack_fffffffffffffec8;
  undefined4 uVar16;
  UA_Node *pUVar15;
  undefined8 in_stack_fffffffffffffed0;
  undefined4 uVar17;
  void **addedNodeId;
  uint local_b8;
  uint local_b0;
  uint local_ac;
  uint local_78;
  uint local_70;
  uint local_6c;
  UA_Node *local_60;
  UA_Node *node;
  UA_InstantiationCallback *instantiationCallback_local;
  UA_AddNodesResult *result_local;
  UA_AddNodesItem *item_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  uVar17 = (undefined4)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  uVar16 = (undefined4)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  local_60 = (UA_Node *)0x0;
  node = (UA_Node *)instantiationCallback;
  instantiationCallback_local = (UA_InstantiationCallback *)result;
  result_local = (UA_AddNodesResult *)item;
  item_local = (UA_AddNodesItem *)session;
  session_local = (UA_Session *)server;
  UVar13 = createNodeFromAttributes(server,item,&local_60);
  *(UA_StatusCode *)&instantiationCallback_local->method = UVar13;
  if (*(int *)&instantiationCallback_local->method == 0) {
    if (local_60 == (UA_Node *)0x0) {
      __assert_fail("node != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                    ,0x55d2,
                    "void Service_AddNodes_single(UA_Server *, UA_Session *, const UA_AddNodesItem *, UA_AddNodesResult *, UA_InstantiationCallback *)"
                   );
    }
    addedNodeId = &instantiationCallback_local->handle;
    pUVar15 = node;
    UVar13 = Service_AddNodes_existing
                       ((UA_Server *)session_local,(UA_Session *)item_local,local_60,
                        (UA_NodeId *)result_local,
                        (UA_NodeId *)&result_local[1].addedNodeId.identifier.string,
                        &result_local[6].addedNodeId,(UA_InstantiationCallback *)node,
                        (UA_NodeId *)addedNodeId);
    uVar17 = (undefined4)((ulong)addedNodeId >> 0x20);
    uVar16 = (undefined4)((ulong)pUVar15 >> 0x20);
    *(UA_StatusCode *)&instantiationCallback_local->method = UVar13;
    if (*(int *)&instantiationCallback_local->method != 0) {
      p_Var12 = (UA_Logger)(session_local->sessionName).length;
      if ((item_local->typeDefinition).nodeId.identifier.string.data == (UA_Byte *)0x0) {
        local_b0 = 0;
      }
      else {
        if (*(long *)((item_local->typeDefinition).nodeId.identifier.string.data + 0xc0) == 0) {
          local_ac = 0;
        }
        else {
          local_ac = *(uint *)(*(long *)((item_local->typeDefinition).nodeId.identifier.string.data
                                        + 0xc0) + 0x38);
        }
        local_b0 = local_ac;
      }
      if ((item_local->typeDefinition).nodeId.identifier.string.data == (UA_Byte *)0x0) {
        local_b8 = 0;
      }
      else {
        local_b8 = *(uint *)((item_local->typeDefinition).nodeId.identifier.string.data + 8);
      }
      uVar11 = *(uint *)((long)&(item_local->nodeAttributes).content + 0x10);
      uVar9 = *(ushort *)
               ((long)&(item_local->nodeAttributes).content.encoded.typeId.identifier + 0xc);
      uVar10 = *(ushort *)
                ((long)&(item_local->nodeAttributes).content.encoded.typeId.identifier + 0xe);
      bVar1 = *(byte *)((long)&(item_local->nodeAttributes).content + 0x18);
      bVar2 = *(byte *)((long)&(item_local->nodeAttributes).content + 0x19);
      bVar3 = *(byte *)((long)&(item_local->nodeAttributes).content + 0x1a);
      bVar4 = *(byte *)((long)&(item_local->nodeAttributes).content + 0x1b);
      bVar5 = *(byte *)((long)&(item_local->nodeAttributes).content + 0x1c);
      bVar6 = *(byte *)((long)&(item_local->nodeAttributes).content + 0x1d);
      bVar7 = *(byte *)((long)&(item_local->nodeAttributes).content + 0x1e);
      bVar8 = *(byte *)((long)&(item_local->nodeAttributes).content + 0x1f);
      pcVar14 = UA_StatusCode_name(*(UA_StatusCode *)&instantiationCallback_local->method);
      UA_LOG_INFO(p_Var12,UA_LOGCATEGORY_SESSION,
                  "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Could not add node with error code %s"
                  ,(ulong)local_b0,(ulong)local_b8,(ulong)uVar11,CONCAT44(uVar16,(uint)uVar9),
                  CONCAT44(uVar17,(uint)uVar10),(uint)bVar1,(uint)bVar2,(uint)bVar3,(uint)bVar4,
                  (uint)bVar5,(uint)bVar6,(uint)bVar7,(uint)bVar8,pcVar14);
    }
  }
  else {
    p_Var12 = (UA_Logger)(session_local->sessionName).length;
    if ((item_local->typeDefinition).nodeId.identifier.string.data == (UA_Byte *)0x0) {
      local_70 = 0;
    }
    else {
      if (*(long *)((item_local->typeDefinition).nodeId.identifier.string.data + 0xc0) == 0) {
        local_6c = 0;
      }
      else {
        local_6c = *(uint *)(*(long *)((item_local->typeDefinition).nodeId.identifier.string.data +
                                      0xc0) + 0x38);
      }
      local_70 = local_6c;
    }
    if ((item_local->typeDefinition).nodeId.identifier.string.data == (UA_Byte *)0x0) {
      local_78 = 0;
    }
    else {
      local_78 = *(uint *)((item_local->typeDefinition).nodeId.identifier.string.data + 8);
    }
    uVar11 = *(uint *)((long)&(item_local->nodeAttributes).content + 0x10);
    uVar9 = *(ushort *)((long)&(item_local->nodeAttributes).content.encoded.typeId.identifier + 0xc)
    ;
    uVar10 = *(ushort *)
              ((long)&(item_local->nodeAttributes).content.encoded.typeId.identifier + 0xe);
    bVar1 = *(byte *)((long)&(item_local->nodeAttributes).content + 0x18);
    bVar2 = *(byte *)((long)&(item_local->nodeAttributes).content + 0x19);
    bVar3 = *(byte *)((long)&(item_local->nodeAttributes).content + 0x1a);
    bVar4 = *(byte *)((long)&(item_local->nodeAttributes).content + 0x1b);
    bVar5 = *(byte *)((long)&(item_local->nodeAttributes).content + 0x1c);
    bVar6 = *(byte *)((long)&(item_local->nodeAttributes).content + 0x1d);
    bVar7 = *(byte *)((long)&(item_local->nodeAttributes).content + 0x1e);
    bVar8 = *(byte *)((long)&(item_local->nodeAttributes).content + 0x1f);
    pcVar14 = UA_StatusCode_name(*(UA_StatusCode *)&instantiationCallback_local->method);
    UA_LOG_INFO(p_Var12,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Could not add node with error code %s"
                ,(ulong)local_70,(ulong)local_78,(ulong)uVar11,CONCAT44(uVar16,(uint)uVar9),
                CONCAT44(uVar17,(uint)uVar10),(uint)bVar1,(uint)bVar2,(uint)bVar3,(uint)bVar4,
                (uint)bVar5,(uint)bVar6,(uint)bVar7,(uint)bVar8,pcVar14);
  }
  return;
}

Assistant:

static void
Service_AddNodes_single(UA_Server *server, UA_Session *session,
                        const UA_AddNodesItem *item, UA_AddNodesResult *result,
                        UA_InstantiationCallback *instantiationCallback) {
    /* Create the node from the attributes*/
    UA_Node *node = NULL;
    result->statusCode = createNodeFromAttributes(server, item, &node);
    if(result->statusCode != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "Could not add node with error code %s",
                            UA_StatusCode_name(result->statusCode));
        return;
    }

    /* Run consistency checks and add the node */
    UA_assert(node != NULL);
    result->statusCode = Service_AddNodes_existing(server, session, node, &item->parentNodeId.nodeId,
                                                   &item->referenceTypeId, &item->typeDefinition.nodeId,
                                                   instantiationCallback, &result->addedNodeId);
    if(result->statusCode != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "Could not add node with error code %s",
                            UA_StatusCode_name(result->statusCode));
    }
}